

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

int __thiscall clunk::HashEntry::Score(HashEntry *this,int ply)

{
  int iVar1;
  int ply_local;
  HashEntry *this_local;
  
  if (99 < (uint)ply) {
    __assert_fail("(ply >= 0) & (ply < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x46,"int clunk::HashEntry::Score(const int) const");
  }
  if (this->score < 0x7919) {
    if (this->score < -31000) {
      if (-0x7919 < this->score + ply) {
        __assert_fail("(score + ply) < -MateScore",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                      ,0x4d,"int clunk::HashEntry::Score(const int) const");
      }
      if (this->score + ply < -31999) {
        __assert_fail("(score + ply) > -Infinity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                      ,0x4e,"int clunk::HashEntry::Score(const int) const");
      }
      this_local._4_4_ = this->score + ply;
    }
    else {
      iVar1 = (int)this->score;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (31999 < iVar1) {
        __assert_fail("abs(score) < Infinity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                      ,0x51,"int clunk::HashEntry::Score(const int) const");
      }
      this_local._4_4_ = (int)this->score;
    }
  }
  else {
    if (this->score - ply < 0x7919) {
      __assert_fail("(score - ply) > MateScore",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0x48,"int clunk::HashEntry::Score(const int) const");
    }
    if (31999 < this->score - ply) {
      __assert_fail("(score - ply) < Infinity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0x49,"int clunk::HashEntry::Score(const int) const");
    }
    this_local._4_4_ = this->score - ply;
  }
  return this_local._4_4_;
}

Assistant:

int Score(const int ply) const {
    // get mate-in-N scores relative to root
    assert((ply >= 0) & (ply < MaxPlies));
    if (score > MateScore) {
      assert((score - ply) > MateScore);
      assert((score - ply) < Infinity);
      return (score - ply);
    }
    if (score < -MateScore) {
      assert((score + ply) < -MateScore);
      assert((score + ply) > -Infinity);
      return (score + ply);
    }
    assert(abs(score) < Infinity);
    return score;
  }